

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O2

int CVmObjString::gen_getp_case_conv
              (vm_val_t *retval,vm_val_t *self_val,char *str,uint *argc,
              _func_wchar_t_ptr_wchar_t *conv)

{
  ushort uVar1;
  anon_union_8_8_cb74652f_for_val aVar2;
  undefined4 uVar3;
  vm_val_t *pvVar4;
  int iVar5;
  wchar_t wVar6;
  wchar_t *pwVar7;
  size_t sVar8;
  size_t byte_size;
  size_t rem;
  utf8_ptr local_58;
  utf8_ptr local_50;
  vm_obj_id_t local_44;
  char *local_40;
  vm_val_t *local_38;
  
  if (gen_getp_case_conv(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*,wchar_t_const*(*)(wchar_t))
      ::desc == '\0') {
    iVar5 = __cxa_guard_acquire(&gen_getp_case_conv(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*,wchar_t_const*(*)(wchar_t))
                                 ::desc);
    if (iVar5 != 0) {
      gen_getp_case_conv::desc.min_argc_ = 0;
      gen_getp_case_conv::desc.opt_argc_ = 0;
      gen_getp_case_conv::desc.varargs_ = 0;
      __cxa_guard_release(&gen_getp_case_conv(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*,wchar_t_const*(*)(wchar_t))
                           ::desc);
    }
  }
  iVar5 = CVmObject::get_prop_check_argc(retval,argc,&gen_getp_case_conv::desc);
  pvVar4 = sp_;
  if (iVar5 == 0) {
    uVar1 = *(ushort *)str;
    uVar3 = *(undefined4 *)&self_val->field_0x4;
    aVar2 = self_val->val;
    sp_ = sp_ + 1;
    pvVar4->typ = self_val->typ;
    *(undefined4 *)&pvVar4->field_0x4 = uVar3;
    pvVar4->val = aVar2;
    local_50.p_ = str + 2;
    byte_size = 0;
    rem = (ulong)uVar1;
    local_40 = local_50.p_;
    local_38 = retval;
    while (rem != 0) {
      wVar6 = utf8_ptr::s_getch(local_50.p_);
      pwVar7 = (*conv)(wVar6);
      if (pwVar7 == (wchar_t *)0x0) {
        sVar8 = 3 - (ulong)((uint)wVar6 < 0x800);
        if (wVar6 < L'\x80') {
          sVar8 = 1;
        }
      }
      else {
        sVar8 = utf8_ptr::s_wstr_size(pwVar7);
      }
      byte_size = byte_size + sVar8;
      utf8_ptr::inc(&local_50,&rem);
    }
    local_44 = create(0,byte_size);
    local_58.p_ = (char *)(*(long *)((long)&G_obj_table_X.pages_[local_44 >> 0xc][local_44 & 0xfff].
                                            ptr_ + 8) + 2);
    local_50.p_ = local_40;
    rem = (ulong)uVar1;
    while (rem != 0) {
      wVar6 = utf8_ptr::s_getch(local_50.p_);
      pwVar7 = (*conv)(wVar6);
      if (pwVar7 == (wchar_t *)0x0) {
        sVar8 = utf8_ptr::s_putch(local_58.p_,wVar6);
        local_58.p_ = local_58.p_ + sVar8;
      }
      else {
        sVar8 = utf8_ptr::setwcharsz(&local_58,pwVar7,byte_size);
      }
      byte_size = byte_size - sVar8;
      utf8_ptr::inc(&local_50,&rem);
    }
    local_38->typ = VM_OBJ;
    (local_38->val).obj = local_44;
    sp_ = sp_ + -1;
  }
  return 1;
}

Assistant:

int CVmObjString::gen_getp_case_conv(
    VMG_ vm_val_t *retval, const vm_val_t *self_val,
    const char *str, uint *argc, const wchar_t *(*conv)(wchar_t))
{
    /* check arguments */
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get my length */
    size_t srclen = vmb_get_len(str);

    /* leave the string on the stack as GC protection */
    G_stk->push(self_val);

    /* 
     *   Scan the string to determine how long the result will be.  The
     *   result won't necessarily be the same length as the original: some
     *   case conversions are 1:N characters, and even when they're 1:1, a
     *   two-byte character in the original could turn into a three-byte
     *   character in the result, and vice versa.
     */
    size_t dstlen;
    utf8_ptr srcp, dstp;
    size_t rem;
    for (dstlen = 0, srcp.set((char *)str + VMB_LEN), rem = srclen ;
         rem != 0 ; srcp.inc(&rem))
    {
        /* get the mapping for this character */
        wchar_t ch = srcp.getch();
        const wchar_t *u = conv(ch);

        /* add up the byte length of the mapping */
        dstlen += (u != 0
                   ? utf8_ptr::s_wstr_size(u)
                   : utf8_ptr::s_wchar_size(ch));
    }

    /* allocate the result string */
    vm_obj_id_t result_obj = CVmObjString::create(vmg_ FALSE, dstlen);

    /* get a pointer to the result buffer */
    dstp.set(((CVmObjString *)vm_objp(vmg_ result_obj))->cons_get_buf());

    /* write the string */
    for (srcp.set((char *)str + VMB_LEN), rem = srclen ;
         rem != 0 ; srcp.inc(&rem))
    {
        /* get the mapping for this character */
        wchar_t ch = srcp.getch();
        const wchar_t *u = conv(ch);

        /* put the character(s) */
        if (u != 0)
            dstlen -= dstp.setwcharsz(u, dstlen);
        else
            dstp.setch(ch, &dstlen);
    }

    /* return the value */
    retval->set_obj(result_obj);

    /* discard GC protection */
    G_stk->discard();

    /* handled */
    return TRUE;
}